

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.cpp
# Opt level: O1

bool Imath_2_5::anon_unknown_8::normalizeOrThrow<int>(Vec4<int> *v)

{
  ulong uVar1;
  IntVecNormalizeExc *this;
  ulong uVar2;
  
  uVar2 = 0xffffffff;
  uVar1 = 0;
  do {
    if ((&v->x)[uVar1] != 0) {
      if ((int)uVar2 != -1) {
        this = (IntVecNormalizeExc *)__cxa_allocate_exception(0x48);
        IntVecNormalizeExc::IntVecNormalizeExc
                  (this,
                   "Cannot normalize an integer vector unless it is parallel to a principal axis");
        __cxa_throw(this,&IntVecNormalizeExc::typeinfo,IntVecNormalizeExc::~IntVecNormalizeExc);
      }
      uVar2 = uVar1 & 0xffffffff;
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 4);
  (&v->x)[(int)uVar2] = (uint)(0 < (&v->x)[(int)uVar2]) * 2 + -1;
  return SUB81(uVar2,0);
}

Assistant:

bool
normalizeOrThrow(Vec4<T> &v)
{
    int axis = -1;
    for (int i = 0; i < 4; i ++)
    {
        if (v[i] != 0)
        {
            if (axis != -1)
            {
                throw IntVecNormalizeExc ("Cannot normalize an integer "
                                          "vector unless it is parallel "
                                          "to a principal axis");
            }
            axis = i;
        }
    }
    v[axis] = (v[axis] > 0) ? 1 : -1;
    return true;
}